

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O2

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  rle16_t *prVar4;
  _Bool _Var5;
  uint uVar6;
  run_container_t *prVar7;
  array_container_t *paVar8;
  bitset_container_t *src_1_00;
  run_container_t *prVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int32_t i;
  uint uVar20;
  ushort *puVar21;
  uint16_t uVar22;
  uint uVar23;
  uint16_t *puVar24;
  uint8_t return_type;
  ushort *local_40;
  container_t **local_38;
  
  local_38 = dst;
  uVar6 = run_container_cardinality(src_1);
  if ((int)uVar6 < 0x21) {
    if (src_2->cardinality != 0) {
      prVar7 = run_container_create_given_capacity(src_2->cardinality + uVar6);
      prVar3 = src_1->runs;
      uVar6 = (uint)prVar3->value;
      uVar18 = (uint)prVar3->value + (uint)prVar3->length + 1;
      local_40 = src_2->array;
      iVar17 = 0;
      uVar23 = 0;
      puVar21 = local_40;
LAB_0012a1ae:
      uVar1 = *puVar21;
      uVar20 = uVar6;
LAB_0012a1b6:
      do {
        uVar6 = uVar20;
        uVar10 = (ushort)uVar6;
        uVar22 = (short)uVar18 + ~uVar10;
LAB_0012a1c3:
        do {
          if (src_1->n_runs <= (int)uVar23) {
LAB_0012a468:
            prVar9 = (run_container_t *)convert_run_to_efficient_container(prVar7,&return_type);
            *local_38 = prVar9;
            if (prVar7 != prVar9) {
              run_container_free(prVar7);
            }
            return (uint)return_type;
          }
          if (src_2->cardinality <= iVar17) {
            prVar4 = prVar7->runs;
            lVar19 = (long)prVar7->n_runs;
            prVar7->n_runs = (int32_t)(lVar19 + 1);
            prVar4[lVar19].value = uVar10;
            prVar4[lVar19].length = uVar22;
            iVar17 = uVar23 + 1;
            iVar12 = src_1->n_runs - iVar17;
            if (iVar12 != 0 && iVar17 <= src_1->n_runs) {
              memcpy(prVar4 + lVar19 + 1,prVar3 + iVar17,(long)iVar12 << 2);
              prVar7->n_runs = prVar7->n_runs + ~uVar23 + src_1->n_runs;
            }
            goto LAB_0012a468;
          }
          uVar20 = (uint)uVar1;
          if (uVar20 < uVar18) {
            if (uVar20 < uVar6) {
              iVar17 = iVar17 + 1;
              if (iVar17 < src_2->cardinality) {
                puVar21 = local_40 + iVar17;
                goto LAB_0012a1ae;
              }
              goto LAB_0012a1c3;
            }
            if (uVar6 < uVar20) {
              prVar4 = prVar7->runs;
              iVar12 = prVar7->n_runs;
              prVar7->n_runs = iVar12 + 1;
              prVar4[iVar12].value = uVar10;
              prVar4[iVar12].length = ~uVar10 + uVar1;
            }
            uVar20 = uVar1 + 1;
            if (uVar1 + 1 < uVar18) goto LAB_0012a1b6;
          }
          else {
            prVar4 = prVar7->runs;
            iVar12 = prVar7->n_runs;
            prVar7->n_runs = iVar12 + 1;
            prVar4[iVar12].value = uVar10;
            prVar4[iVar12].length = uVar22;
          }
          uVar23 = uVar23 + 1;
        } while (src_1->n_runs <= (int)uVar23);
        uVar18 = (uint)prVar3[(int)uVar23].value + (uint)prVar3[(int)uVar23].length + 1;
        uVar20 = (uint)prVar3[(int)uVar23].value;
      } while( true );
    }
    prVar7 = run_container_clone(src_1);
    *local_38 = prVar7;
    iVar17 = 3;
  }
  else if (uVar6 < 0x1001) {
    paVar8 = array_container_create_given_capacity(uVar6);
    uVar13 = 0;
    uVar16 = (ulong)(uint)src_1->n_runs;
    if (src_1->n_runs < 1) {
      uVar16 = uVar13;
    }
    iVar17 = -1;
    iVar12 = 0;
    for (; uVar13 != uVar16; uVar13 = uVar13 + 1) {
      uVar1 = src_1->runs[uVar13].value;
      uVar6 = (uint)uVar1;
      uVar18 = (uint)src_1->runs[uVar13].length + (uint)uVar1;
      puVar24 = src_2->array;
      iVar2 = src_2->cardinality;
      iVar14 = iVar17 + 1;
      iVar15 = iVar14;
      if ((iVar14 < iVar2) && (puVar24[iVar14] < uVar1)) {
        for (iVar11 = 1; iVar15 = iVar14 + iVar11, iVar15 < iVar2; iVar11 = iVar11 * 2) {
          uVar10 = puVar24[iVar15];
          if (uVar1 <= uVar10) goto LAB_0012a2ea;
        }
        uVar10 = puVar24[(long)iVar2 + -1];
        iVar15 = iVar2 + -1;
LAB_0012a2ea:
        if (uVar10 == uVar1) goto LAB_0012a2fc;
        iVar17 = iVar2;
        if (uVar1 <= uVar10) {
          iVar17 = (iVar11 >> 1) + iVar14;
          while (iVar14 = iVar15, iVar15 = iVar14, iVar17 + 1 != iVar14) {
            iVar15 = iVar14 + iVar17 >> 1;
            if (puVar24[iVar15] == uVar1) break;
            if (puVar24[iVar15] < uVar1) {
              iVar17 = iVar15;
              iVar15 = iVar14;
            }
          }
          goto LAB_0012a2fc;
        }
LAB_0012a367:
        puVar24 = paVar8->array + iVar12;
        for (; uVar6 <= uVar18; uVar6 = uVar6 + 1) {
          *puVar24 = (uint16_t)uVar6;
          iVar12 = iVar12 + 1;
          puVar24 = puVar24 + 1;
        }
      }
      else {
LAB_0012a2fc:
        iVar17 = iVar15;
        if (iVar2 <= iVar15) goto LAB_0012a367;
        uVar23 = (uint)puVar24[iVar15];
        if (uVar18 < puVar24[iVar15]) {
          puVar24 = paVar8->array + iVar12;
          for (; uVar6 <= uVar18; uVar6 = uVar6 + 1) {
            *puVar24 = (uint16_t)uVar6;
            iVar12 = iVar12 + 1;
            puVar24 = puVar24 + 1;
          }
        }
        else {
          for (; uVar6 <= uVar18; uVar6 = uVar6 + 1) {
            if (uVar6 == uVar23) {
              iVar17 = iVar15 + 1;
              if (iVar17 < iVar2) {
                uVar23 = (uint)puVar24[iVar17];
                iVar15 = iVar17;
              }
              else {
                uVar23 = 0;
              }
            }
            else {
              lVar19 = (long)iVar12;
              iVar12 = iVar12 + 1;
              paVar8->array[lVar19] = (uint16_t)uVar6;
            }
          }
        }
        iVar17 = iVar15 + -1;
      }
    }
    paVar8->cardinality = iVar12;
    *local_38 = paVar8;
    iVar17 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var5 = bitset_array_container_iandnot(src_1_00,src_2,local_38);
    iVar17 = 2 - (uint)_Var5;
  }
  return iVar17;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}